

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::MultiNodeChain<QtGraphicsAnchorLayout::GraphPath>::free
          (MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *this,void *__ptr)

{
  MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *pMVar1;
  
  while (this != (MultiNodeChain<QtGraphicsAnchorLayout::GraphPath> *)0x0) {
    pMVar1 = this->next;
    QtGraphicsAnchorLayout::GraphPath::~GraphPath(&this->value);
    operator_delete(this,0x18);
    this = pMVar1;
  }
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }